

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<long_long,fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,longlong value,
          basic_format_specs<wchar_t> *spec)

{
  long in_RDX;
  int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_ffffffffffffffb8;
  char spec_00;
  basic_format_specs<wchar_t> *in_stack_ffffffffffffffc8;
  longlong in_stack_ffffffffffffffd0;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffd8;
  int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_ffffffffffffffe0;
  
  spec_00 = *(char *)(in_RDX + 8);
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::
  int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::int_writer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>>
            (spec_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }